

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::ThreadOpenConnections
          (CConnman *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          connect,Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  seed_nodes)

{
  ConnectionType CVar1;
  pointer pcVar2;
  ServiceFlags SVar3;
  CChainParams *pCVar4;
  byte *pbVar5;
  pointer ppCVar6;
  pointer pCVar7;
  AddrMan *this_00;
  string_view source_file;
  CService ipIn;
  CService ipIn_00;
  optional<Network> network;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint16_t port;
  int iVar12;
  Network net;
  int iVar13;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar14;
  microseconds mVar15;
  microseconds mVar16;
  microseconds mVar17;
  size_t sVar18;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar19;
  duration dVar20;
  time_point tVar21;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar22;
  size_type sVar23;
  Logger *pLVar24;
  duration rel_time;
  long in_RCX;
  ulong uVar25;
  char *args;
  long lVar26;
  undefined8 uVar27;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> __first;
  ConnectionType CVar28;
  __normal_iterator<CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_> _Var29;
  CAddress *pCVar30;
  int iVar31;
  uint uVar32;
  pointer pcVar33;
  long lVar34;
  pointer ppCVar35;
  ulong uVar36;
  string *strDest;
  undefined8 uVar37;
  CThreadInterrupt *pCVar38;
  size_type sVar39;
  CConnman *this_01;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  Span<const_std::byte> sp;
  string_view str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  ConnectionType in_stack_fffffffffffffbf4;
  int iVar41;
  undefined4 uVar42;
  uint in_stack_fffffffffffffc00;
  undefined4 uVar43;
  undefined4 uVar44;
  uint uVar45;
  uint32_t in_stack_fffffffffffffc04;
  uint32_t uVar46;
  CConnman *this_02;
  int local_3dc;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  duration local_3b8;
  allocator<char> local_381;
  char *local_380;
  NodeSeconds addr_last_try;
  unordered_set<Network,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<Network>_>
  fixed_seed_networks;
  optional<Network> preferred_net;
  CSemaphoreGrant grant;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  ParamsStream<DataStream,_CAddress::SerParams> s;
  undefined2 local_268;
  undefined6 uStack_266;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  outbound_ipv46_peer_netgroups;
  CService local_230;
  FastRandomContext rng;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock77;
  CAddress addrConnect;
  CAddress addr;
  vector<CAddress,_std::allocator<CAddress>_> seed_addrs;
  string local_58;
  long local_38;
  
  pbVar40 = seed_nodes.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rng,false);
  pcVar33 = (pbVar40->_M_dataplus)._M_p;
  pcVar2 = (pointer)pbVar40->_M_string_length;
  iVar41 = (int)pcVar2;
  uVar42 = (undefined4)((ulong)pcVar2 >> 0x20);
  if (pcVar33 == pcVar2) {
    this_02 = this;
    tVar14 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                       ();
    mVar15 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x7270e00);
    mVar16 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
    mVar17 = RandomMixin<FastRandomContext>::rand_exp_duration
                       (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-dnsseed",(allocator<char> *)&addrConnect);
    bVar8 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    uVar43 = CONCAT13(bVar8,(int3)in_stack_fffffffffffffbf0);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-fixedseeds",(allocator<char> *)&addrConnect);
    bVar8 = ArgsManager::GetBoolArg(&gArgs,(string *)&addr,true);
    std::__cxx11::string::~string((string *)&addr);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&addr,"-seednode",(allocator<char> *)&addrConnect);
    bVar9 = ArgsManager::IsArgSet(&gArgs,(string *)&addr);
    std::__cxx11::string::~string((string *)&addr);
    local_3b8.__r = (rep)NodeClock::now();
    sVar18 = AddrMan::Size(this->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
    if (!bVar8) {
      logging_function._M_str = "ThreadOpenConnections";
      logging_function._M_len = 0x15;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
      source_file_00._M_len = 0x50;
      ::LogPrintf_<>(logging_function,source_file_00,0x9c1,ALL,Info,"Fixed seeds are disabled\n");
    }
    local_3c8 = mVar15.__r + (long)tVar14.__d.__r;
    local_3c0 = mVar16.__r + (long)tVar14.__d.__r;
    local_3d0 = mVar17.__r + (long)tVar14.__d.__r;
    uVar45 = (uint)(sVar18 == 0 && in_RCX != 0);
    pCVar38 = &this->interruptNet;
    uVar43 = CONCAT13((byte)((uint)uVar43 >> 0x18) | bVar9,(int3)uVar43);
    local_3d8 = in_RCX;
    do {
      bVar9 = CThreadInterrupt::operator_cast_to_bool(pCVar38);
      if (bVar9) break;
      this_01 = this_02;
      if ((uVar45 & 1) != 0) {
        local_3d8 = local_3d8 + -1;
        strDest = (string *)(local_3d8 * 0x20 + seed_nodes.m_size);
        AddAddrFetch(this_02,strDest);
        sVar18 = AddrMan::Size(this_02->addrman,(optional<Network>)0x0,(optional<bool>)0x0);
        if (sVar18 == 0) {
          logging_function_01._M_str = "ThreadOpenConnections";
          logging_function_01._M_len = 0x15;
          source_file_02._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_02._M_len = 0x50;
          ::LogPrintf_<std::__cxx11::string>
                    (logging_function_01,source_file_02,0x9cc,ALL,Info,
                     "Empty addrman, adding seednode (%s) to addrfetch\n",strDest);
        }
        else {
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)0xa;
          logging_function_00._M_str = "ThreadOpenConnections";
          logging_function_00._M_len = 0x15;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_01._M_len = 0x50;
          LogPrintf_<long,std::__cxx11::string>
                    (logging_function_00,source_file_01,0x9ce,ALL,Info,
                     "Couldn\'t connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n"
                     ,(long *)&addr,strDest);
        }
      }
      ProcessAddrFetch(this_02);
      bVar9 = CThreadInterrupt::sleep_for(pCVar38,(duration)0x1dcd6500);
      if (!bVar9) break;
      this_02 = this_01;
      PerformReconnections(this_01);
      grant.sem = (this_01->semOutbound)._M_t.
                  super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
                  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
                  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl;
      grant.fHaveGrant = false;
      CSemaphoreGrant::Acquire(&grant);
      bVar9 = CThreadInterrupt::operator_cast_to_bool(pCVar38);
      if (bVar9) {
        CSemaphoreGrant::Release(&grant);
        break;
      }
      GetReachableEmptyNetworks(&fixed_seed_networks,this_01);
      if ((fixed_seed_networks._M_h._M_element_count != 0 & bVar8) == 1) {
        tVar19 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                           ();
        if ((long)tVar19.__d.__r * 1000000 - ((long)tVar14.__d.__r + 60000000) == 0 ||
            (long)tVar19.__d.__r * 1000000 < (long)tVar14.__d.__r + 60000000) {
          bVar8 = true;
          if ((char)((uint)uVar43 >> 0x18) == '\0') {
            UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&addr,&this->m_added_nodes_mutex,
                       "m_added_nodes_mutex",
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                       ,0x9ec,false);
            if ((this_01->m_added_node_params).
                super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                super__Vector_impl_data._M_start ==
                (this_01->m_added_node_params).
                super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              logging_function_05._M_str = "ThreadOpenConnections";
              logging_function_05._M_len = 0x15;
              source_file_06._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_06._M_len = 0x50;
              ::LogPrintf_<>(logging_function_05,source_file_06,0x9ef,ALL,Info,
                             "Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n"
                            );
              std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
              goto LAB_0017dfb2;
            }
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&addr);
          }
        }
        else {
          logging_function_02._M_str = "ThreadOpenConnections";
          logging_function_02._M_len = 0x15;
          source_file_03._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_03._M_len = 0x50;
          ::LogPrintf_<>(logging_function_02,source_file_03,0x9e7,ALL,Info,
                         "Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n"
                        );
LAB_0017dfb2:
          pCVar4 = this_01->m_params;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          FastRandomContext::FastRandomContext((FastRandomContext *)&addr,false);
          pbVar5 = (pCVar4->vFixedSeeds).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sp.m_size = (long)(pCVar4->vFixedSeeds).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pbVar5;
          sp.m_data = pbVar5;
          DataStream::DataStream((DataStream *)&addrConnect,sp);
          sVar39 = addrConnect.super_CService.super_CNetAddr._24_8_;
          s.m_substream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)addrConnect.super_CService.super_CNetAddr.m_addr._16_8_;
          uVar37 = addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
          uVar27 = addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                   indirect;
          s.m_params = &CAddress::V2_NETWORK;
          s.m_substream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
                        indirect;
          s.m_substream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_;
          addrConnect.super_CService.super_CNetAddr.m_addr._size = 0;
          addrConnect.super_CService.super_CNetAddr.m_addr._20_4_ = 0;
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)0x0;
          addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
          s.m_substream.m_read_pos._0_4_ = addrConnect.super_CService.super_CNetAddr.m_net;
          s.m_substream.m_read_pos._4_4_ = addrConnect.super_CService.super_CNetAddr.m_scope_id;
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&addrConnect)
          ;
          this_01 = this_02;
          while ((pointer)(uVar27 + sVar39) != (pointer)uVar37) {
            CService::CService((CService *)&outbound_ipv46_peer_netgroups);
            CService::
            SerializationOps<ParamsStream<DataStream,CAddress::SerParams>,CService,ActionUnserialize>
                      ((CService *)&outbound_ipv46_peer_netgroups,&s);
            CService::CService((CService *)&criticalblock77,
                               (CService *)&outbound_ipv46_peer_netgroups);
            ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.capacity = uVar43;
            ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                 (char *)in_stack_fffffffffffffbe8;
            ipIn_00.super_CNetAddr.m_addr._union._12_4_ = in_stack_fffffffffffffbf4;
            ipIn_00.super_CNetAddr.m_addr._size = iVar41;
            ipIn_00.super_CNetAddr.m_addr._20_4_ = uVar42;
            ipIn_00.super_CNetAddr.m_net = in_stack_fffffffffffffc00;
            ipIn_00.super_CNetAddr.m_scope_id = in_stack_fffffffffffffc04;
            ipIn_00._32_8_ = this_01;
            CAddress::CAddress(&addrConnect,ipIn_00,(ServiceFlags)&criticalblock77);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&criticalblock77);
            tVar19 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                               ();
            dVar20 = RandomMixin<FastRandomContext>::
                     rand_uniform_duration<std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               ((RandomMixin<FastRandomContext> *)&addr,(duration)0xfffffffffff6c580
                               );
            addrConnect.nTime.__d.__r = (duration)(dVar20.__r + (long)tVar19.__d.__r + -0x93a80);
            bVar8 = ::LogAcceptCategory(NET,Debug);
            if (bVar8) {
              CService::ToStringAddrPort_abi_cxx11_(&local_58,&addrConnect.super_CService);
              logging_function_03._M_str = "ConvertSeeds";
              logging_function_03._M_len = 0xc;
              source_file_04._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_04._M_len = 0x50;
              ::LogPrintf_<std::__cxx11::string>
                        (logging_function_03,source_file_04,0xcf,NET,Debug,
                         "Added hardcoded seed: %s\n",&local_58);
              std::__cxx11::string::~string((string *)&local_58);
            }
            std::vector<CAddress,_std::allocator<CAddress>_>::push_back(&seed_addrs,&addrConnect);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &outbound_ipv46_peer_netgroups);
            uVar27 = s.m_substream.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar37 = s.m_substream.vch.
                     super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            sVar39 = s.m_substream.m_read_pos;
          }
          std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                    ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                     &s.m_substream);
          ChaCha20::~ChaCha20((ChaCha20 *)&addr.super_CService.super_CNetAddr.m_addr._size);
          pCVar7 = seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)&fixed_seed_networks;
          lVar26 = (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_start;
          _Var29._M_current =
               seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
               super__Vector_impl_data._M_start;
          this_02 = this_01;
          addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect;
          for (lVar34 = lVar26 / 0x38 >> 2; 0 < lVar34; lVar34 = lVar34 + -1) {
            bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,_Var29);
            __first._M_current = _Var29._M_current;
            if (bVar8) goto LAB_0017e356;
            bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,_Var29._M_current + 1);
            __first._M_current = _Var29._M_current + 1;
            if (bVar8) goto LAB_0017e356;
            bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,_Var29._M_current + 2);
            __first._M_current = _Var29._M_current + 2;
            if (bVar8) goto LAB_0017e356;
            bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,_Var29._M_current + 3);
            __first._M_current = _Var29._M_current + 3;
            if (bVar8) goto LAB_0017e356;
            _Var29._M_current = _Var29._M_current + 4;
            lVar26 = lVar26 + -0xe0;
          }
          lVar26 = lVar26 / 0x38;
          if (lVar26 == 1) {
LAB_0017e33d:
            bVar8 = __gnu_cxx::__ops::
                    _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                    ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                  *)&addr,_Var29);
            __first._M_current = _Var29._M_current;
            if (!bVar8) {
              __first._M_current = pCVar7;
            }
LAB_0017e356:
            _Var29._M_current = __first._M_current;
            if (__first._M_current != pCVar7) {
              while (_Var29._M_current = _Var29._M_current + 1, _Var29._M_current != pCVar7) {
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                        ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                      *)&addrConnect,_Var29);
                if (!bVar8) {
                  CAddress::operator=(__first._M_current,_Var29._M_current);
                  __first._M_current = __first._M_current + 1;
                }
              }
            }
          }
          else {
            if (lVar26 == 2) {
LAB_0017e325:
              bVar8 = __gnu_cxx::__ops::
                      _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                      ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                    *)&addr,_Var29);
              __first._M_current = _Var29._M_current;
              if (!bVar8) {
                _Var29._M_current = _Var29._M_current + 1;
                goto LAB_0017e33d;
              }
              goto LAB_0017e356;
            }
            __first._M_current = pCVar7;
            if (lVar26 == 3) {
              bVar8 = __gnu_cxx::__ops::
                      _Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::$_0>
                      ::operator()((_Iter_pred<CConnman::ThreadOpenConnections(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Span<std::__cxx11::string_const>)::__0>
                                    *)&addr,_Var29);
              __first._M_current = _Var29._M_current;
              if (!bVar8) {
                _Var29._M_current = _Var29._M_current + 1;
                goto LAB_0017e325;
              }
              goto LAB_0017e356;
            }
          }
          std::vector<CAddress,_std::allocator<CAddress>_>::erase
                    (&seed_addrs,(const_iterator)__first._M_current,
                     (const_iterator)
                     seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          CNetAddr::CNetAddr((CNetAddr *)&addr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&addrConnect,"fixedseeds",(allocator<char> *)&s);
          CNetAddr::SetInternal((CNetAddr *)&addr,(string *)&addrConnect);
          std::__cxx11::string::~string((string *)&addrConnect);
          AddrMan::Add(this_01->addrman,&seed_addrs,(CNetAddr *)&addr,(seconds)0x0);
          addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
               (char *)(((long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)seed_addrs.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x38);
          logging_function_04._M_str = "ThreadOpenConnections";
          logging_function_04._M_len = 0x15;
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_05._M_len = 0x50;
          LogPrintf_<unsigned_long>
                    (logging_function_04,source_file_05,0xa02,
                     I2P|VALIDATION|QT|MEMPOOLREJ|PROXY|PRUNE|REINDEX|ESTIMATEFEE|RPC|HTTP|TOR,
                     (Level)&addrConnect,(char *)0x38,(unsigned_long *)in_stack_fffffffffffffbe8);
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
          std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&seed_addrs);
          bVar8 = false;
        }
      }
      CAddress::CAddress(&addrConnect);
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (&criticalblock77,&this->m_nodes_mutex,"m_nodes_mutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
                 0xa12,false);
      ppCVar35 = (this_01->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar6 = (this_01->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar44 = SUB84(ppCVar6,0);
      in_stack_fffffffffffffc04 = (uint32_t)((ulong)ppCVar6 >> 0x20);
      local_3dc = 0;
      iVar31 = 0;
      CVar28 = INBOUND;
      for (; ppCVar35 != (pointer)CONCAT44(in_stack_fffffffffffffc04,uVar44);
          ppCVar35 = ppCVar35 + 1) {
        CVar1 = (*ppCVar35)->m_conn_type;
        iVar41 = iVar31;
        this_01 = this_02;
        if ((CVar1 < ADDR_FETCH) && ((0x16U >> (CVar1 & 0x1f) & 1) != 0)) {
          CAddress::CAddress(&addr,&(*ppCVar35)->addr);
          if (addr.super_CService.super_CNetAddr.m_net - NET_ONION < 3) {
            local_3dc = local_3dc + 1;
            iVar41 = iVar31;
            this_01 = this_02;
          }
          else {
            NetGroupManager::GetGroup
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,
                       this_02->m_netgroupman,(CNetAddr *)&addr);
            std::
            _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ::_M_insert_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        *)&outbound_ipv46_peer_netgroups,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
            in_stack_fffffffffffffbf4 = CVar28;
            iVar41 = iVar31;
            this_01 = this_02;
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
        }
        CVar28 = CVar28 + (CVar1 == OUTBOUND_FULL_RELAY);
        iVar31 = iVar41 + (uint)(CVar1 == BLOCK_RELAY);
        this_02 = this_01;
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock77.super_unique_lock);
      uVar45 = 0;
      if ((local_3d8 != 0) && (CVar28 < MANUAL)) {
        tVar21 = NodeClock::now();
        if (local_3b8.__r + 10000000000 < (long)tVar21.__d.__r) {
          uVar45 = (uint)CONCAT71(tVar21.__d.__r._1_7_,1);
          local_3b8.__r = (rep)NodeClock::now();
        }
        else {
          uVar45 = 0;
        }
      }
      tVar22 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                         ();
      preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
      super__Optional_payload_base<Network>._4_4_ =
           preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
           super__Optional_payload_base<Network>._4_4_ & 0xffffff00;
      bVar9 = (this_01->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this_01->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish;
      iVar13 = this_01->m_max_outbound_block_relay;
      if (iVar13 <= iVar31 || bVar9) {
        if ((int)CVar28 < this_01->m_max_outbound_full_relay) {
          in_stack_fffffffffffffbf4 = OUTBOUND_FULL_RELAY;
          goto LAB_0017e68e;
        }
        if (iVar31 < iVar13) goto LAB_0017e66b;
        if (((this_01->m_try_another_outbound_peer)._M_base._M_i & 1U) != 0) {
LAB_0017ed57:
          iVar41 = 0;
          in_stack_fffffffffffffbf4 = OUTBOUND_FULL_RELAY;
          goto LAB_0017e697;
        }
        if ((local_3c0 < (long)tVar22.__d.__r) &&
           (((this_01->m_start_extra_block_relay_peers)._M_base._M_i & 1U) != 0)) {
          mVar15 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
          local_3c0 = mVar15.__r + (long)tVar22.__d.__r;
          iVar41 = 0;
          in_stack_fffffffffffffbf4 = BLOCK_RELAY;
          goto LAB_0017e697;
        }
        if (local_3c8 < (long)tVar22.__d.__r) {
          mVar15 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x7270e00);
          local_3c8 = mVar15.__r + (long)tVar22.__d.__r;
          iVar41 = (int)CONCAT71((int7)((ulong)local_3c8 >> 8),1);
          in_stack_fffffffffffffbf4 = FEELER;
          goto LAB_0017e697;
        }
        in_stack_fffffffffffffc00 = uVar45;
        if ((((CVar28 == 8) && (this_01->m_max_outbound_full_relay == 8)) &&
            (local_3d0 < (long)tVar22.__d.__r)) &&
           (bVar10 = MaybePickPreferredNetwork(this_01,&preferred_net), bVar10)) {
          mVar15 = RandomMixin<FastRandomContext>::rand_exp_duration
                             (&rng.super_RandomMixin<FastRandomContext>,(microseconds)0x11e1a300);
          local_3d0 = mVar15.__r + (long)tVar22.__d.__r;
          goto LAB_0017ed57;
        }
        iVar31 = 10;
      }
      else {
LAB_0017e66b:
        in_stack_fffffffffffffbf4 = BLOCK_RELAY;
LAB_0017e68e:
        iVar41 = 0;
LAB_0017e697:
        AddrMan::ResolveCollisions(this_01->addrman);
        uVar32 = 0;
        tVar21 = NodeClock::now();
        in_stack_fffffffffffffc00 = (uint)tVar21.__d.__r;
        in_stack_fffffffffffffc04 = tVar21.__d.__r._4_4_;
        while (bVar10 = CThreadInterrupt::operator_cast_to_bool(pCVar38), !bVar10) {
          if ((iVar13 <= iVar31 || bVar9) ||
             (pCVar7 = (this_01->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
             (this_01->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start == pCVar7)) {
            if (uVar32 == 100) break;
            CAddress::CAddress((CAddress *)&s);
            addr_last_try.__d.__r = (duration)0;
            if ((char)iVar41 == '\0') {
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_engaged =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_engaged;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._5_3_ =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._5_3_;
              network.super__Optional_base<Network,_true,_true>._M_payload.
              super__Optional_payload_base<Network>._M_payload._M_value =
                   preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_payload._M_value;
              AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               *)&addr,this_01->addrman,false,network);
              criticalblock77.super_unique_lock._M_device = (mutex_type *)&addr_last_try;
              criticalblock77.super_unique_lock._8_8_ = &s;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&criticalblock77,
                          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&addr);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&addr,
                         this_01->m_netgroupman,(CNetAddr *)&s);
              sVar23 = std::
                       set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::count(&outbound_ipv46_peer_netgroups,(key_type *)&addr);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr);
              if (sVar23 == 0) goto LAB_0017e96e;
            }
            else {
              AddrMan::SelectTriedCollision
                        ((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                          *)&addr,this_01->addrman);
              criticalblock77.super_unique_lock._M_device = (mutex_type *)&addr_last_try;
              criticalblock77.super_unique_lock._8_8_ = &s;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&criticalblock77,
                          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&addr);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
              bVar10 = CNetAddr::IsValid((CNetAddr *)&s);
              if (bVar10) {
                bVar10 = AlreadyConnectedToAddress(this_01,(CAddress *)&s);
                if (!bVar10) goto LAB_0017e96e;
                this_00 = this_01->addrman;
                tVar19 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                                   ();
                AddrMan::Good(this_00,(CService *)&s,(NodeSeconds)tVar19.__d.__r);
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this_01->addrman,true,(optional<Network>)0x0);
              }
              else {
                AddrMan::Select((pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                                 *)&addr,this_01->addrman,true,(optional<Network>)0x0);
              }
              criticalblock77.super_unique_lock._M_device = (mutex_type *)&addr_last_try;
              criticalblock77.super_unique_lock._8_8_ = &s;
              std::
              tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
              ::operator=((tuple<CAddress&,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>&>
                           *)&criticalblock77,
                          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                           *)&addr);
              prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
LAB_0017e96e:
              bVar10 = CNetAddr::IsValid((CNetAddr *)&s);
              if ((!bVar10) || (bVar10 = IsLocal((CService *)&s), bVar10)) {
LAB_0017eeff:
                pCVar30 = (CAddress *)&s;
                goto LAB_0017ef07;
              }
              bVar10 = ReachableNets::Contains(&g_reachable_nets,(CNetAddr *)&s);
              if ((bVar10) &&
                 (599999999999 <
                  (long)addr_last_try.__d.__r * -1000000000 +
                  CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00) || 0x1c < uVar32)) {
                if ((char)iVar41 == '\0') {
                  iVar12 = (*this_01->m_msgproc->_vptr_NetEventsInterface[2])
                                     (this_01->m_msgproc,CONCAT62(uStack_266,local_268));
                  if ((char)iVar12 != '\0') goto LAB_0017ea1c;
                }
                else if ((local_268 & (NODE_NETWORK_LIMITED|NODE_NETWORK)) != NODE_NONE) {
LAB_0017ea1c:
                  if ((uVar32 < 0x31) &&
                     ((int)s.m_substream.vch.
                           super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage - 1U < 2)) {
                    port = CService::GetPort((CService *)&s);
                    bVar10 = IsBadPort(port);
                    if (bVar10) goto LAB_0017e9dc;
                  }
                  bVar10 = AddedNodesContain(this_01,(CAddress *)&s);
                  if (!bVar10) {
                    CAddress::operator=(&addrConnect,(CAddress *)&s);
                    goto LAB_0017eeff;
                  }
                  bVar10 = ::LogAcceptCategory(NET,Debug);
                  if (bVar10) {
                    local_380 = "";
                    args = "network-specific ";
                    if (preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                        super__Optional_payload_base<Network>._M_engaged != false) {
                      local_380 = "network-specific ";
                    }
                    ConnectionTypeAsString_abi_cxx11_(&local_2b8,in_stack_fffffffffffffbf4);
                    net = CNetAddr::GetNetwork((CNetAddr *)&s);
                    GetNetworkName_abi_cxx11_(&local_2d8,net);
                    bVar10 = fLogIPs;
                    if (fLogIPs == true) {
                      CService::ToStringAddrPort_abi_cxx11_(&local_318,(CService *)&s);
                      tinyformat::format<std::__cxx11::string>
                                (&local_2f8,(tinyformat *)0x699e43,(char *)&local_318,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args);
                    }
                    else {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2f8,"",&local_381);
                    }
                    pLVar24 = LogInstance();
                    bVar11 = BCLog::Logger::Enabled(pLVar24);
                    if (bVar11) {
                      addr.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
                           (char *)&addr.super_CService.super_CNetAddr.m_addr._size;
                      addr.super_CService.super_CNetAddr.m_addr._union._8_8_ = 0;
                      addr.super_CService.super_CNetAddr.m_addr._size._0_1_ = 0;
                      tinyformat::
                      format<char_const*,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                ((string *)&criticalblock77,
                                 (tinyformat *)
                                 "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n"
                                 ,(char *)&local_380,(char **)&local_2b8,&local_2d8,&local_2f8,
                                 in_stack_fffffffffffffbe8);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&addr,(string *)&criticalblock77);
                      std::__cxx11::string::~string((string *)&criticalblock77);
                      pLVar24 = LogInstance();
                      criticalblock77.super_unique_lock._M_device = (mutex_type *)&DAT_00000050;
                      criticalblock77.super_unique_lock._8_8_ = anon_var_dwarf_105745;
                      source_file._M_str =
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                      ;
                      source_file._M_len = 0x50;
                      logging_function_09._M_str = "ThreadOpenConnections";
                      logging_function_09._M_len = 0x15;
                      str._M_str = addr.super_CService.super_CNetAddr.m_addr._union.
                                   indirect_contents.indirect;
                      str._M_len = addr.super_CService.super_CNetAddr.m_addr._union._8_8_;
                      BCLog::Logger::LogPrintStr
                                (pLVar24,str,logging_function_09,source_file,0xae1,NET,Debug);
                      std::__cxx11::string::~string((string *)&addr);
                    }
                    std::__cxx11::string::~string((string *)&local_2f8);
                    if (bVar10 != false) {
                      std::__cxx11::string::~string((string *)&local_318);
                    }
                    std::__cxx11::string::~string((string *)&local_2d8);
                    std::__cxx11::string::~string((string *)&local_2b8);
                  }
                }
              }
            }
LAB_0017e9dc:
            uVar32 = uVar32 + 1;
            pCVar30 = (CAddress *)&s;
          }
          else {
            CAddress::CAddress(&addr,pCVar7 + -1);
            std::vector<CAddress,_std::allocator<CAddress>_>::pop_back(&this->m_anchors);
            bVar10 = CNetAddr::IsValid((CNetAddr *)&addr);
            if ((((bVar10) && (bVar10 = IsLocal(&addr.super_CService), !bVar10)) &&
                (bVar10 = ReachableNets::Contains(&g_reachable_nets,(CNetAddr *)&addr), bVar10)) &&
               (iVar12 = (*this_01->m_msgproc->_vptr_NetEventsInterface[2])
                                   (this_01->m_msgproc,addr.nServices), (char)iVar12 != '\0')) {
              NetGroupManager::GetGroup
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,
                         this_01->m_netgroupman,(CNetAddr *)&addr);
              sVar23 = std::
                       set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::count(&outbound_ipv46_peer_netgroups,(key_type *)&s);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
              if (sVar23 == 0) {
                CAddress::operator=(&addrConnect,&addr);
                bVar9 = ::LogAcceptCategory(NET,Debug);
                if (bVar9) {
                  CService::ToStringAddrPort_abi_cxx11_((string *)&s,&addrConnect.super_CService);
                  logging_function_06._M_str = "ThreadOpenConnections";
                  logging_function_06._M_len = 0x15;
                  source_file_07._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
                  ;
                  source_file_07._M_len = 0x50;
                  ::LogPrintf_<std::__cxx11::string>
                            (logging_function_06,source_file_07,0xa90,NET,Debug,
                             "Trying to make an anchor connection to %s\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s
                            );
                  std::__cxx11::string::~string((string *)&s);
                }
                pCVar30 = &addr;
LAB_0017ef07:
                prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                          ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pCVar30);
                break;
              }
            }
            pCVar30 = &addr;
          }
          prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)pCVar30);
        }
        bVar9 = CNetAddr::IsValid((CNetAddr *)&addrConnect);
        iVar31 = 0;
        if (bVar9) {
          if ((char)iVar41 != '\0') {
            rel_time = RandomMixin<FastRandomContext>::
                       rand_uniform_duration<std::chrono::_V2::steady_clock>
                                 (&rng.super_RandomMixin<FastRandomContext>,(duration)0x3b9aca00);
            bVar9 = CThreadInterrupt::sleep_for(pCVar38,rel_time);
            if (!bVar9) {
              iVar31 = 1;
              goto LAB_0017f0cf;
            }
            bVar9 = ::LogAcceptCategory(NET,Debug);
            if (bVar9) {
              CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
              logging_function_07._M_str = "ThreadOpenConnections";
              logging_function_07._M_len = 0x15;
              source_file_08._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_08._M_len = 0x50;
              ::LogPrintf_<std::__cxx11::string>
                        (logging_function_07,source_file_08,0xaef,NET,Debug,
                         "Making feeler connection to %s\n",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr)
              ;
              std::__cxx11::string::~string((string *)&addr);
            }
          }
          if ((preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
               super__Optional_payload_base<Network>._M_engaged == true) &&
             (bVar9 = ::LogAcceptCategory(NET,Debug), bVar9)) {
            CService::ToStringAddrPort_abi_cxx11_((string *)&addr,&addrConnect.super_CService);
            pbVar40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17f003;
            GetNetworkName_abi_cxx11_
                      ((string *)&s,
                       preferred_net.super__Optional_base<Network,_true,_true>._M_payload.
                       super__Optional_payload_base<Network>._M_payload._M_value);
            logging_function_08._M_str = "ThreadOpenConnections";
            logging_function_08._M_len = 0x15;
            source_file_09._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
            source_file_09._M_len = 0x50;
            LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_08,source_file_09,0xaf2,NET,0x69ca72,(char *)&addr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                       pbVar40);
            std::__cxx11::string::~string((string *)&s);
            std::__cxx11::string::~string((string *)&addr);
          }
          iVar13 = this_01->m_max_automatic_connections;
          if (2 < iVar13) {
            iVar13 = 3;
          }
          iVar31 = 0;
          OpenNetworkConnection
                    (this_01,&addrConnect,
                     iVar13 + -1 <=
                     local_3dc +
                     (int)outbound_ipv46_peer_netgroups._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,&grant,(char *)0x0,in_stack_fffffffffffffbf4,
                     (bool)((byte)((uint)((undefined4)addrConnect.nServices &
                                         (int)this_01->nLocalServices) >> 0xb) & 1));
        }
      }
LAB_0017f0cf:
      std::
      _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~_Rb_tree(&outbound_ipv46_peer_netgroups._M_t);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addrConnect);
      std::
      _Hashtable<Network,_Network,_std::allocator<Network>,_std::__detail::_Identity,_std::equal_to<Network>,_std::hash<Network>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&fixed_seed_networks._M_h);
      CSemaphoreGrant::Release(&grant);
    } while ((iVar31 == 0) || (iVar31 == 10));
  }
  else {
    SVar3 = this->nLocalServices;
    pCVar38 = &this->interruptNet;
    uVar25 = 0;
    while( true ) {
      uVar43 = (undefined4)uVar25;
      uVar46 = (uint32_t)(uVar25 >> 0x20);
      uVar36 = 10;
      if (uVar25 < 10) {
        uVar36 = uVar25;
      }
      for (; pcVar33 != (pointer)CONCAT44(uVar42,iVar41); pcVar33 = pcVar33 + 0x20) {
        CService::CService(&local_230);
        ipIn.super_CNetAddr.m_addr._union.indirect_contents.capacity = in_stack_fffffffffffffbf0;
        ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)in_stack_fffffffffffffbe8;
        ipIn.super_CNetAddr.m_addr._union._12_4_ = in_stack_fffffffffffffbf4;
        ipIn.super_CNetAddr.m_addr._size = iVar41;
        ipIn.super_CNetAddr.m_addr._20_4_ = uVar42;
        ipIn.super_CNetAddr.m_net = uVar43;
        ipIn.super_CNetAddr.m_scope_id = uVar46;
        ipIn._32_8_ = this;
        CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_230);
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_230);
        addrConnect.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
             (char *)0x0;
        addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ =
             addrConnect.super_CService.super_CNetAddr.m_addr._union._8_8_ & 0xffffffffffffff00;
        OpenNetworkConnection
                  (this,&addr,false,(CSemaphoreGrant *)&addrConnect,*(char **)pcVar33,MANUAL,
                   (bool)((byte)(SVar3 >> 0xb) & 1));
        CSemaphoreGrant::Release((CSemaphoreGrant *)&addrConnect);
        lVar26 = uVar36 + 1;
        while (lVar26 = lVar26 + -1, lVar26 != 0) {
          bVar8 = CThreadInterrupt::sleep_for(pCVar38,(duration)0x1dcd6500);
          if (!bVar8) {
            prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
            goto LAB_0017dbfa;
          }
        }
        prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
      }
      bVar8 = CThreadInterrupt::sleep_for(pCVar38,(duration)0x1dcd6500);
      if (!bVar8) break;
      PerformReconnections(this);
      uVar25 = CONCAT44(uVar46,uVar43) + 1;
      pcVar33 = (pbVar40->_M_dataplus)._M_p;
      iVar41 = (int)pbVar40->_M_string_length;
      uVar42 = (undefined4)(pbVar40->_M_string_length >> 0x20);
    }
  }
LAB_0017dbfa:
  ChaCha20::~ChaCha20(&rng.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::ThreadOpenConnections(const std::vector<std::string> connect, Span<const std::string> seed_nodes)
{
    AssertLockNotHeld(m_unused_i2p_sessions_mutex);
    AssertLockNotHeld(m_reconnections_mutex);
    FastRandomContext rng;
    // Connect to specific addresses
    if (!connect.empty())
    {
        // Attempt v2 connection if we support v2 - we'll reconnect with v1 if our
        // peer doesn't support it or immediately disconnects us for another reason.
        const bool use_v2transport(GetLocalServices() & NODE_P2P_V2);
        for (int64_t nLoop = 0;; nLoop++)
        {
            for (const std::string& strAddr : connect)
            {
                CAddress addr(CService(), NODE_NONE);
                OpenNetworkConnection(addr, false, {}, strAddr.c_str(), ConnectionType::MANUAL, /*use_v2transport=*/use_v2transport);
                for (int i = 0; i < 10 && i < nLoop; i++)
                {
                    if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                        return;
                }
            }
            if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
                return;
            PerformReconnections();
        }
    }

    // Initiate network connections
    auto start = GetTime<std::chrono::microseconds>();

    // Minimum time before next feeler connection (in microseconds).
    auto next_feeler = start + rng.rand_exp_duration(FEELER_INTERVAL);
    auto next_extra_block_relay = start + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
    auto next_extra_network_peer{start + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL)};
    const bool dnsseed = gArgs.GetBoolArg("-dnsseed", DEFAULT_DNSSEED);
    bool add_fixed_seeds = gArgs.GetBoolArg("-fixedseeds", DEFAULT_FIXEDSEEDS);
    const bool use_seednodes{gArgs.IsArgSet("-seednode")};

    auto seed_node_timer = NodeClock::now();
    bool add_addr_fetch{addrman.Size() == 0 && !seed_nodes.empty()};
    constexpr std::chrono::seconds ADD_NEXT_SEEDNODE = 10s;

    if (!add_fixed_seeds) {
        LogPrintf("Fixed seeds are disabled\n");
    }

    while (!interruptNet)
    {
        if (add_addr_fetch) {
            add_addr_fetch = false;
            const auto& seed{SpanPopBack(seed_nodes)};
            AddAddrFetch(seed);

            if (addrman.Size() == 0) {
                LogInfo("Empty addrman, adding seednode (%s) to addrfetch\n", seed);
            } else {
                LogInfo("Couldn't connect to peers from addrman after %d seconds. Adding seednode (%s) to addrfetch\n", ADD_NEXT_SEEDNODE.count(), seed);
            }
        }

        ProcessAddrFetch();

        if (!interruptNet.sleep_for(std::chrono::milliseconds(500)))
            return;

        PerformReconnections();

        CSemaphoreGrant grant(*semOutbound);
        if (interruptNet)
            return;

        const std::unordered_set<Network> fixed_seed_networks{GetReachableEmptyNetworks()};
        if (add_fixed_seeds && !fixed_seed_networks.empty()) {
            // When the node starts with an empty peers.dat, there are a few other sources of peers before
            // we fallback on to fixed seeds: -dnsseed, -seednode, -addnode
            // If none of those are available, we fallback on to fixed seeds immediately, else we allow
            // 60 seconds for any of those sources to populate addrman.
            bool add_fixed_seeds_now = false;
            // It is cheapest to check if enough time has passed first.
            if (GetTime<std::chrono::seconds>() > start + std::chrono::minutes{1}) {
                add_fixed_seeds_now = true;
                LogPrintf("Adding fixed seeds as 60 seconds have passed and addrman is empty for at least one reachable network\n");
            }

            // Perform cheap checks before locking a mutex.
            else if (!dnsseed && !use_seednodes) {
                LOCK(m_added_nodes_mutex);
                if (m_added_node_params.empty()) {
                    add_fixed_seeds_now = true;
                    LogPrintf("Adding fixed seeds as -dnsseed=0 (or IPv4/IPv6 connections are disabled via -onlynet) and neither -addnode nor -seednode are provided\n");
                }
            }

            if (add_fixed_seeds_now) {
                std::vector<CAddress> seed_addrs{ConvertSeeds(m_params.FixedSeeds())};
                // We will not make outgoing connections to peers that are unreachable
                // (e.g. because of -onlynet configuration).
                // Therefore, we do not add them to addrman in the first place.
                // In case previously unreachable networks become reachable
                // (e.g. in case of -onlynet changes by the user), fixed seeds will
                // be loaded only for networks for which we have no addresses.
                seed_addrs.erase(std::remove_if(seed_addrs.begin(), seed_addrs.end(),
                                                [&fixed_seed_networks](const CAddress& addr) { return fixed_seed_networks.count(addr.GetNetwork()) == 0; }),
                                 seed_addrs.end());
                CNetAddr local;
                local.SetInternal("fixedseeds");
                addrman.Add(seed_addrs, local);
                add_fixed_seeds = false;
                LogPrintf("Added %d fixed seeds from reachable networks.\n", seed_addrs.size());
            }
        }

        //
        // Choose an address to connect to based on most recently seen
        //
        CAddress addrConnect;

        // Only connect out to one peer per ipv4/ipv6 network group (/16 for IPv4).
        int nOutboundFullRelay = 0;
        int nOutboundBlockRelay = 0;
        int outbound_privacy_network_peers = 0;
        std::set<std::vector<unsigned char>> outbound_ipv46_peer_netgroups;

        {
            LOCK(m_nodes_mutex);
            for (const CNode* pnode : m_nodes) {
                if (pnode->IsFullOutboundConn()) nOutboundFullRelay++;
                if (pnode->IsBlockOnlyConn()) nOutboundBlockRelay++;

                // Make sure our persistent outbound slots to ipv4/ipv6 peers belong to different netgroups.
                switch (pnode->m_conn_type) {
                    // We currently don't take inbound connections into account. Since they are
                    // free to make, an attacker could make them to prevent us from connecting to
                    // certain peers.
                    case ConnectionType::INBOUND:
                    // Short-lived outbound connections should not affect how we select outbound
                    // peers from addrman.
                    case ConnectionType::ADDR_FETCH:
                    case ConnectionType::FEELER:
                        break;
                    case ConnectionType::MANUAL:
                    case ConnectionType::OUTBOUND_FULL_RELAY:
                    case ConnectionType::BLOCK_RELAY:
                        const CAddress address{pnode->addr};
                        if (address.IsTor() || address.IsI2P() || address.IsCJDNS()) {
                            // Since our addrman-groups for these networks are
                            // random, without relation to the route we
                            // take to connect to these peers or to the
                            // difficulty in obtaining addresses with diverse
                            // groups, we don't worry about diversity with
                            // respect to our addrman groups when connecting to
                            // these networks.
                            ++outbound_privacy_network_peers;
                        } else {
                            outbound_ipv46_peer_netgroups.insert(m_netgroupman.GetGroup(address));
                        }
                } // no default case, so the compiler can warn about missing cases
            }
        }

        if (!seed_nodes.empty() && nOutboundFullRelay < SEED_OUTBOUND_CONNECTION_THRESHOLD) {
            if (NodeClock::now() > seed_node_timer + ADD_NEXT_SEEDNODE) {
                seed_node_timer = NodeClock::now();
                add_addr_fetch = true;
            }
        }

        ConnectionType conn_type = ConnectionType::OUTBOUND_FULL_RELAY;
        auto now = GetTime<std::chrono::microseconds>();
        bool anchor = false;
        bool fFeeler = false;
        std::optional<Network> preferred_net;

        // Determine what type of connection to open. Opening
        // BLOCK_RELAY connections to addresses from anchors.dat gets the highest
        // priority. Then we open OUTBOUND_FULL_RELAY priority until we
        // meet our full-relay capacity. Then we open BLOCK_RELAY connection
        // until we hit our block-relay-only peer limit.
        // GetTryNewOutboundPeer() gets set when a stale tip is detected, so we
        // try opening an additional OUTBOUND_FULL_RELAY connection. If none of
        // these conditions are met, check to see if it's time to try an extra
        // block-relay-only peer (to confirm our tip is current, see below) or the next_feeler
        // timer to decide if we should open a FEELER.

        if (!m_anchors.empty() && (nOutboundBlockRelay < m_max_outbound_block_relay)) {
            conn_type = ConnectionType::BLOCK_RELAY;
            anchor = true;
        } else if (nOutboundFullRelay < m_max_outbound_full_relay) {
            // OUTBOUND_FULL_RELAY
        } else if (nOutboundBlockRelay < m_max_outbound_block_relay) {
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (GetTryNewOutboundPeer()) {
            // OUTBOUND_FULL_RELAY
        } else if (now > next_extra_block_relay && m_start_extra_block_relay_peers) {
            // Periodically connect to a peer (using regular outbound selection
            // methodology from addrman) and stay connected long enough to sync
            // headers, but not much else.
            //
            // Then disconnect the peer, if we haven't learned anything new.
            //
            // The idea is to make eclipse attacks very difficult to pull off,
            // because every few minutes we're finding a new peer to learn headers
            // from.
            //
            // This is similar to the logic for trying extra outbound (full-relay)
            // peers, except:
            // - we do this all the time on an exponential timer, rather than just when
            //   our tip is stale
            // - we potentially disconnect our next-youngest block-relay-only peer, if our
            //   newest block-relay-only peer delivers a block more recently.
            //   See the eviction logic in net_processing.cpp.
            //
            // Because we can promote these connections to block-relay-only
            // connections, they do not get their own ConnectionType enum
            // (similar to how we deal with extra outbound peers).
            next_extra_block_relay = now + rng.rand_exp_duration(EXTRA_BLOCK_RELAY_ONLY_PEER_INTERVAL);
            conn_type = ConnectionType::BLOCK_RELAY;
        } else if (now > next_feeler) {
            next_feeler = now + rng.rand_exp_duration(FEELER_INTERVAL);
            conn_type = ConnectionType::FEELER;
            fFeeler = true;
        } else if (nOutboundFullRelay == m_max_outbound_full_relay &&
                   m_max_outbound_full_relay == MAX_OUTBOUND_FULL_RELAY_CONNECTIONS &&
                   now > next_extra_network_peer &&
                   MaybePickPreferredNetwork(preferred_net)) {
            // Full outbound connection management: Attempt to get at least one
            // outbound peer from each reachable network by making extra connections
            // and then protecting "only" peers from a network during outbound eviction.
            // This is not attempted if the user changed -maxconnections to a value
            // so low that less than MAX_OUTBOUND_FULL_RELAY_CONNECTIONS are made,
            // to prevent interactions with otherwise protected outbound peers.
            next_extra_network_peer = now + rng.rand_exp_duration(EXTRA_NETWORK_PEER_INTERVAL);
        } else {
            // skip to next iteration of while loop
            continue;
        }

        addrman.ResolveCollisions();

        const auto current_time{NodeClock::now()};
        int nTries = 0;
        while (!interruptNet)
        {
            if (anchor && !m_anchors.empty()) {
                const CAddress addr = m_anchors.back();
                m_anchors.pop_back();
                if (!addr.IsValid() || IsLocal(addr) || !g_reachable_nets.Contains(addr) ||
                    !m_msgproc->HasAllDesirableServiceFlags(addr.nServices) ||
                    outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) continue;
                addrConnect = addr;
                LogDebug(BCLog::NET, "Trying to make an anchor connection to %s\n", addrConnect.ToStringAddrPort());
                break;
            }

            // If we didn't find an appropriate destination after trying 100 addresses fetched from addrman,
            // stop this loop, and let the outer loop run again (which sleeps, adds seed nodes, recalculates
            // already-connected network ranges, ...) before trying new addrman addresses.
            nTries++;
            if (nTries > 100)
                break;

            CAddress addr;
            NodeSeconds addr_last_try{0s};

            if (fFeeler) {
                // First, try to get a tried table collision address. This returns
                // an empty (invalid) address if there are no collisions to try.
                std::tie(addr, addr_last_try) = addrman.SelectTriedCollision();

                if (!addr.IsValid()) {
                    // No tried table collisions. Select a new table address
                    // for our feeler.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                } else if (AlreadyConnectedToAddress(addr)) {
                    // If test-before-evict logic would have us connect to a
                    // peer that we're already connected to, just mark that
                    // address as Good(). We won't be able to initiate the
                    // connection anyway, so this avoids inadvertently evicting
                    // a currently-connected peer.
                    addrman.Good(addr);
                    // Select a new table address for our feeler instead.
                    std::tie(addr, addr_last_try) = addrman.Select(true);
                }
            } else {
                // Not a feeler
                // If preferred_net has a value set, pick an extra outbound
                // peer from that network. The eviction logic in net_processing
                // ensures that a peer from another network will be evicted.
                std::tie(addr, addr_last_try) = addrman.Select(false, preferred_net);
            }

            // Require outbound IPv4/IPv6 connections, other than feelers, to be to distinct network groups
            if (!fFeeler && outbound_ipv46_peer_netgroups.count(m_netgroupman.GetGroup(addr))) {
                continue;
            }

            // if we selected an invalid or local address, restart
            if (!addr.IsValid() || IsLocal(addr)) {
                break;
            }

            if (!g_reachable_nets.Contains(addr)) {
                continue;
            }

            // only consider very recently tried nodes after 30 failed attempts
            if (current_time - addr_last_try < 10min && nTries < 30) {
                continue;
            }

            // for non-feelers, require all the services we'll want,
            // for feelers, only require they be a full node (only because most
            // SPV clients don't have a good address DB available)
            if (!fFeeler && !m_msgproc->HasAllDesirableServiceFlags(addr.nServices)) {
                continue;
            } else if (fFeeler && !MayHaveUsefulAddressDB(addr.nServices)) {
                continue;
            }

            // Do not connect to bad ports, unless 50 invalid addresses have been selected already.
            if (nTries < 50 && (addr.IsIPv4() || addr.IsIPv6()) && IsBadPort(addr.GetPort())) {
                continue;
            }

            // Do not make automatic outbound connections to addnode peers, to
            // not use our limited outbound slots for them and to ensure
            // addnode connections benefit from their intended protections.
            if (AddedNodesContain(addr)) {
                LogPrintLevel(BCLog::NET, BCLog::Level::Debug, "Not making automatic %s%s connection to %s peer selected for manual (addnode) connection%s\n",
                              preferred_net.has_value() ? "network-specific " : "",
                              ConnectionTypeAsString(conn_type), GetNetworkName(addr.GetNetwork()),
                              fLogIPs ? strprintf(": %s", addr.ToStringAddrPort()) : "");
                continue;
            }

            addrConnect = addr;
            break;
        }

        if (addrConnect.IsValid()) {
            if (fFeeler) {
                // Add small amount of random noise before connection to avoid synchronization.
                if (!interruptNet.sleep_for(rng.rand_uniform_duration<CThreadInterrupt::Clock>(FEELER_SLEEP_WINDOW))) {
                    return;
                }
                LogDebug(BCLog::NET, "Making feeler connection to %s\n", addrConnect.ToStringAddrPort());
            }

            if (preferred_net != std::nullopt) LogDebug(BCLog::NET, "Making network specific connection to %s on %s.\n", addrConnect.ToStringAddrPort(), GetNetworkName(preferred_net.value()));

            // Record addrman failure attempts when node has at least 2 persistent outbound connections to peers with
            // different netgroups in ipv4/ipv6 networks + all peers in Tor/I2P/CJDNS networks.
            // Don't record addrman failure attempts when node is offline. This can be identified since all local
            // network connections (if any) belong in the same netgroup, and the size of `outbound_ipv46_peer_netgroups` would only be 1.
            const bool count_failures{((int)outbound_ipv46_peer_netgroups.size() + outbound_privacy_network_peers) >= std::min(m_max_automatic_connections - 1, 2)};
            // Use BIP324 transport when both us and them have NODE_V2_P2P set.
            const bool use_v2transport(addrConnect.nServices & GetLocalServices() & NODE_P2P_V2);
            OpenNetworkConnection(addrConnect, count_failures, std::move(grant), /*strDest=*/nullptr, conn_type, use_v2transport);
        }
    }
}